

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlHasFeature(xmlFeature feature)

{
  int local_c;
  xmlFeature feature_local;
  
  switch(feature) {
  case XML_WITH_THREAD:
    local_c = 1;
    break;
  case XML_WITH_TREE:
    local_c = 1;
    break;
  case XML_WITH_OUTPUT:
    local_c = 1;
    break;
  case XML_WITH_PUSH:
    local_c = 1;
    break;
  case XML_WITH_READER:
    local_c = 1;
    break;
  case XML_WITH_PATTERN:
    local_c = 1;
    break;
  case XML_WITH_WRITER:
    local_c = 1;
    break;
  case XML_WITH_SAX1:
    local_c = 1;
    break;
  default:
    local_c = 0;
    break;
  case XML_WITH_HTTP:
    local_c = 0;
    break;
  case XML_WITH_VALID:
    local_c = 1;
    break;
  case XML_WITH_HTML:
    local_c = 1;
    break;
  case XML_WITH_LEGACY:
    local_c = 0;
    break;
  case XML_WITH_C14N:
    local_c = 1;
    break;
  case XML_WITH_CATALOG:
    local_c = 1;
    break;
  case XML_WITH_XPATH:
    local_c = 1;
    break;
  case XML_WITH_XPTR:
    local_c = 1;
    break;
  case XML_WITH_XINCLUDE:
    local_c = 1;
    break;
  case XML_WITH_ICONV:
    local_c = 1;
    break;
  case XML_WITH_ISO8859X:
    local_c = 1;
    break;
  case XML_WITH_UNICODE:
    local_c = 1;
    break;
  case XML_WITH_REGEXP:
    local_c = 1;
    break;
  case XML_WITH_AUTOMATA:
    local_c = 1;
    break;
  case XML_WITH_EXPR:
    local_c = 0;
    break;
  case XML_WITH_SCHEMAS:
    local_c = 1;
    break;
  case XML_WITH_SCHEMATRON:
    local_c = 1;
    break;
  case XML_WITH_MODULES:
    local_c = 1;
    break;
  case XML_WITH_DEBUG:
    local_c = 1;
    break;
  case XML_WITH_DEBUG_MEM:
    local_c = 0;
    break;
  case XML_WITH_ZLIB:
    local_c = 0;
    break;
  case XML_WITH_ICU:
    local_c = 0;
    break;
  case XML_WITH_LZMA:
    local_c = 0;
  }
  return local_c;
}

Assistant:

int
xmlHasFeature(xmlFeature feature)
{
    switch (feature) {
	case XML_WITH_THREAD:
#ifdef LIBXML_THREAD_ENABLED
	    return(1);
#else
	    return(0);
#endif
        case XML_WITH_TREE:
            return(1);
        case XML_WITH_OUTPUT:
#ifdef LIBXML_OUTPUT_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_PUSH:
#ifdef LIBXML_PUSH_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_READER:
#ifdef LIBXML_READER_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_PATTERN:
#ifdef LIBXML_PATTERN_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_WRITER:
#ifdef LIBXML_WRITER_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_SAX1:
#ifdef LIBXML_SAX1_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_HTTP:
#ifdef LIBXML_HTTP_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_VALID:
#ifdef LIBXML_VALID_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_HTML:
#ifdef LIBXML_HTML_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_LEGACY:
#ifdef LIBXML_LEGACY_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_C14N:
#ifdef LIBXML_C14N_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_CATALOG:
#ifdef LIBXML_CATALOG_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_XPATH:
#ifdef LIBXML_XPATH_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_XPTR:
#ifdef LIBXML_XPTR_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_XINCLUDE:
#ifdef LIBXML_XINCLUDE_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_ICONV:
#ifdef LIBXML_ICONV_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_ISO8859X:
#ifdef LIBXML_ISO8859X_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_UNICODE:
#ifdef LIBXML_UNICODE_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_REGEXP:
#ifdef LIBXML_REGEXP_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_AUTOMATA:
#ifdef LIBXML_REGEXP_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_EXPR:
#ifdef LIBXML_EXPR_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_SCHEMAS:
#ifdef LIBXML_SCHEMAS_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_SCHEMATRON:
#ifdef LIBXML_SCHEMATRON_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_MODULES:
#ifdef LIBXML_MODULES_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_DEBUG:
#ifdef LIBXML_DEBUG_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_DEBUG_MEM:
            return(0);
        case XML_WITH_ZLIB:
#ifdef LIBXML_ZLIB_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_LZMA:
#ifdef LIBXML_LZMA_ENABLED
            return(1);
#else
            return(0);
#endif
        case XML_WITH_ICU:
#ifdef LIBXML_ICU_ENABLED
            return(1);
#else
            return(0);
#endif
        default:
	    break;
     }
     return(0);
}